

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O2

bool __thiscall Corrade::Utility::Configuration::save(Configuration *this,string *filename)

{
  ssize_t sVar1;
  Debug *debug;
  ostringstream out;
  Error local_1f0;
  Path *local_1c8;
  int local_1c0;
  BasicStringView<const_char> local_1b8;
  void *local_1a8;
  size_t local_1a0;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  save(this,(ostream *)local_198);
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string_const&,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_1c8,filename);
  std::__cxx11::stringbuf::str();
  Containers::BasicStringView<char_const>::
  BasicStringView<std::__cxx11::string,Corrade::Containers::BasicStringView<char_const>>
            ((BasicStringView<char_const> *)&local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0);
  Containers::ArrayView<void_const>::
  ArrayView<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayView<char_const>>
            ((ArrayView<void_const> *)&local_1a8,&local_1b8);
  sVar1 = Path::write(local_1c8,local_1c0,local_1a8,local_1a0);
  std::__cxx11::string::~string((string *)&local_1f0);
  if ((char)sVar1 == '\0') {
    Error::Error(&local_1f0,(Flags)0x0);
    debug = Debug::operator<<(&local_1f0.super_Debug,
                              "Utility::Configuration::save(): cannot open file");
    Implementation::debugPrintStlString(debug,filename);
    Error::~Error(&local_1f0);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return (bool)(char)sVar1;
}

Assistant:

bool Configuration::save(const std::string& filename) {
    /* Save to a stringstream and then write it as a string to the file. Doing
       it this way to avoid issues with Unicode filenames on Windows. */
    /** @todo get rid of streams altogether, and then of the StringView cast
        also */
    std::ostringstream out;
    save(out);
    if(Path::write(filename, Containers::StringView{out.str()}))
        return true;

    Error() << "Utility::Configuration::save(): cannot open file" << filename;
    return false;
}